

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_truncation.c
# Opt level: O0

int main(void)

{
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined4 local_3c;
  undefined8 uStack_38;
  int new_len;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  undefined4 local_18;
  uint local_14;
  uint buf_len;
  uint second_len;
  uint first_len;
  
  __vla_expr0 = (unsigned_long)&local_58;
  second_len = 0;
  buf_len = 0xfffffeff;
  local_14 = 0x100;
  local_18 = 0x100;
  __vla_expr1 = 0xfffffeff;
  local_58 = &stack0xffffffff000000a8;
  __vla_expr2 = 0x100;
  local_50 = &stack0xfffffffeffffffa8;
  uStack_38 = 0x100;
  local_48 = &stack0xfffffffefffffea8;
  local_3c = 0xffffffff;
  memcpy(local_48,local_58,0xfffffeff);
  memcpy(local_48 + buf_len,local_50,(ulong)local_14);
  return second_len;
}

Assistant:

int main() {
  unsigned int first_len = UINT_MAX - 256;
  unsigned int second_len = 256;
  unsigned int buf_len = 256;

  char first[first_len], second[second_len], buf[buf_len];
  int new_len = (first_len + second_len); // <- IDB (negative)

  if (new_len <= 256) {
    memcpy(buf, first, first_len);
    memcpy(buf + first_len, second, second_len);
  }
}